

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.cpp
# Opt level: O0

int __thiscall trun::Process_Unix::ConsumePipes(Process_Unix *this,ProcessCallbackBase *callback)

{
  int iVar1;
  initializer_list<pollfd> __l;
  undefined8 uVar2;
  reference pvVar3;
  size_type __nfds;
  reference pvVar4;
  size_type sVar5;
  ssize_t sVar6;
  string local_e0 [36];
  int local_bc;
  string local_b8 [4];
  int bytes_read_1;
  int local_94;
  int local_90;
  int bytes_read;
  int rval;
  short local_84;
  short local_82;
  int local_80;
  undefined2 local_7c;
  undefined2 local_7a;
  iterator local_78;
  size_type local_70;
  undefined1 local_68 [8];
  vector<pollfd,_std::allocator<pollfd>_> plist;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string buffer;
  ProcessCallbackBase *callback_local;
  Process_Unix *this_local;
  
  buffer.field_2._8_8_ = callback;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,0x400,' ',&local_39);
  std::allocator<char>::~allocator(&local_39);
  rval = this->pipe_stdout[0];
  local_84 = 1;
  local_82 = 0;
  local_80 = this->pipe_stderr[0];
  local_7c = 1;
  local_7a = 0;
  local_78 = (iterator)&rval;
  local_70 = 2;
  std::allocator<pollfd>::allocator((allocator<pollfd> *)((long)&bytes_read + 3));
  __l._M_len = local_70;
  __l._M_array = local_78;
  std::vector<pollfd,_std::allocator<pollfd>_>::vector
            ((vector<pollfd,_std::allocator<pollfd>_> *)local_68,__l,
             (allocator<pollfd> *)((long)&bytes_read + 3));
  std::allocator<pollfd>::~allocator((allocator<pollfd> *)((long)&bytes_read + 3));
  pvVar3 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[]
                     ((vector<pollfd,_std::allocator<pollfd>_> *)local_68,0);
  __nfds = std::vector<pollfd,_std::allocator<pollfd>_>::size
                     ((vector<pollfd,_std::allocator<pollfd>_> *)local_68);
  local_90 = poll((pollfd *)pvVar3,__nfds,0);
  pvVar3 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[]
                     ((vector<pollfd,_std::allocator<pollfd>_> *)local_68,0);
  if ((pvVar3->revents & 1U) == 0) {
    pvVar3 = std::vector<pollfd,_std::allocator<pollfd>_>::operator[]
                       ((vector<pollfd,_std::allocator<pollfd>_> *)local_68,1);
    if ((pvVar3->revents & 1U) != 0) {
      iVar1 = this->pipe_stderr[0];
      pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,0);
      sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              length((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
      sVar6 = read(iVar1,pvVar4,sVar5);
      local_bc = (int)sVar6;
      pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38,(long)local_bc);
      uVar2 = buffer.field_2._8_8_;
      *pvVar4 = '\0';
      std::__cxx11::string::string
                (local_e0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_38);
      (**(code **)(*(long *)uVar2 + 0x18))(uVar2,local_e0);
      std::__cxx11::string::~string(local_e0);
    }
  }
  else {
    iVar1 = this->pipe_stdout[0];
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_38,0);
    sVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::length
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38
                      );
    sVar6 = read(iVar1,pvVar4,sVar5);
    local_94 = (int)sVar6;
    pvVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             operator[]((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_38,(long)local_94);
    uVar2 = buffer.field_2._8_8_;
    *pvVar4 = '\0';
    std::__cxx11::string::string
              (local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_38);
    (**(code **)(*(long *)uVar2 + 0x10))(uVar2,local_b8);
    std::__cxx11::string::~string(local_b8);
  }
  iVar1 = local_90;
  std::vector<pollfd,_std::allocator<pollfd>_>::~vector
            ((vector<pollfd,_std::allocator<pollfd>_> *)local_68);
  std::__cxx11::string::~string((string *)local_38);
  return iVar1;
}

Assistant:

int Process_Unix::ConsumePipes(ProcessCallbackBase *callback) {

	std::string buffer(1024,' ');
	std::vector<pollfd> plist = { {pipe_stdout[0],POLLIN, 0}, {pipe_stderr[0],POLLIN, 0} };
	int rval=poll(&plist[0],plist.size(),/*timeout*/0);
    if ( plist[0].revents&POLLIN) {
      int bytes_read = read(pipe_stdout[0], &buffer[0], buffer.length());
      // cout << "read " << bytes_read << " bytes from stdout.\n";
      // cout << buffer.substr(0, static_cast<size_t>(bytes_read)) << "\n";
	  buffer[bytes_read] = '\0';
      callback->OnStdOutData(buffer);
    }
    else if ( plist[1].revents&POLLIN ) {
      int bytes_read = read(pipe_stderr[0], &buffer[0], buffer.length());
      // cout << "read " << bytes_read << " bytes from stderr.\n";
      // cout << buffer.substr(0, static_cast<size_t>(bytes_read)) << "\n";
	  buffer[bytes_read] = '\0';
      callback->OnStdErrData(buffer);
    }
	return rval;

}